

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O0

void intgemm::SSSE3::Kernels8::PrepareA
               (float *input,uint8_t *output,float quant_mult,Index rows,Index cols)

{
  undefined8 in_RSI;
  uint8_t *in_RDI;
  float *unaff_retaddr;
  
  QuantizeU(unaff_retaddr,in_RDI,(float)((ulong)in_RSI >> 0x20),(Index)in_RSI);
  return;
}

Assistant:

INTGEMM_SSSE3 static inline void PrepareA(const float *input, uint8_t *output, float quant_mult, Index rows, Index cols) {
    QuantizeU(input, output, quant_mult, rows * cols);
  }